

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBFabFactory.cpp
# Opt level: O0

int __thiscall amrex::EBFArrayBoxFactory::maxCoarseningLevel(EBFArrayBoxFactory *this)

{
  long in_RDI;
  IndexSpace *ebis;
  Geometry *in_stack_00000048;
  Geometry *in_stack_00000050;
  IndexSpace *in_stack_00000058;
  undefined4 local_4;
  
  if (*(long *)(in_RDI + 0xe8) == 0) {
    local_4 = EB2::maxCoarseningLevel(in_stack_00000048);
  }
  else {
    EB2::Level::getEBIndexSpace(*(Level **)(in_RDI + 0xe8));
    local_4 = EB2::maxCoarseningLevel(in_stack_00000058,in_stack_00000050);
  }
  return local_4;
}

Assistant:

int
EBFArrayBoxFactory::maxCoarseningLevel () const noexcept
{
    if (m_parent) {
        EB2::IndexSpace const* ebis = m_parent->getEBIndexSpace();
        return EB2::maxCoarseningLevel(ebis, m_geom);
    } else {
        return EB2::maxCoarseningLevel(m_geom);
    }
}